

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

void parse_cert_parameter(char *cert_parameter,char **certname,char **passphrase)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_40;
  char *certname_place;
  char *param_place;
  size_t span;
  size_t param_length;
  char **passphrase_local;
  char **certname_local;
  char *cert_parameter_local;
  
  sVar3 = strlen(cert_parameter);
  *certname = (char *)0x0;
  *passphrase = (char *)0x0;
  if (sVar3 != 0) {
    iVar2 = curl_strnequal(cert_parameter,"pkcs11:",7);
    if ((iVar2 == 0) && (pcVar4 = strpbrk(cert_parameter,":\\"), pcVar4 != (char *)0x0)) {
      local_40 = (char *)malloc(sVar3 + 1);
      if (local_40 != (char *)0x0) {
        *certname = local_40;
        certname_place = cert_parameter;
        while (*certname_place != '\0') {
          sVar3 = strcspn(certname_place,":\\");
          strncpy(local_40,certname_place,sVar3);
          certname_place = certname_place + sVar3;
          local_40 = local_40 + sVar3;
          cVar1 = *certname_place;
          if (cVar1 != '\0') {
            if (cVar1 == ':') {
              sVar3 = strlen(certname_place + 1);
              if (sVar3 != 0) {
                pcVar4 = strdup(certname_place + 1);
                *passphrase = pcVar4;
              }
              break;
            }
            if (cVar1 == '\\') {
              pcVar4 = certname_place + 1;
              cVar1 = *pcVar4;
              if (cVar1 == '\0') {
                *local_40 = '\\';
                local_40 = local_40 + 1;
                certname_place = pcVar4;
              }
              else if (cVar1 == ':') {
                *local_40 = ':';
                local_40 = local_40 + 1;
                certname_place = certname_place + 2;
              }
              else if (cVar1 == '\\') {
                *local_40 = '\\';
                local_40 = local_40 + 1;
                certname_place = certname_place + 2;
              }
              else {
                *local_40 = '\\';
                local_40[1] = *pcVar4;
                local_40 = local_40 + 2;
                certname_place = certname_place + 2;
              }
            }
          }
        }
        *local_40 = '\0';
      }
    }
    else {
      pcVar4 = strdup(cert_parameter);
      *certname = pcVar4;
    }
  }
  return;
}

Assistant:

void parse_cert_parameter(const char *cert_parameter,
                          char **certname,
                          char **passphrase)
{
  size_t param_length = strlen(cert_parameter);
  size_t span;
  const char *param_place = NULL;
  char *certname_place = NULL;
  *certname = NULL;
  *passphrase = NULL;

  /* most trivial assumption: cert_parameter is empty */
  if(param_length == 0)
    return;

  /* next less trivial: cert_parameter starts 'pkcs11:' and thus
   * looks like a RFC7512 PKCS#11 URI which can be used as-is.
   * Also if cert_parameter contains no colon nor backslash, this
   * means no passphrase was given and no characters escaped */
  if(curl_strnequal(cert_parameter, "pkcs11:", 7) ||
     !strpbrk(cert_parameter, ":\\")) {
    *certname = strdup(cert_parameter);
    return;
  }
  /* deal with escaped chars; find unescaped colon if it exists */
  certname_place = malloc(param_length + 1);
  if(!certname_place)
    return;

  *certname = certname_place;
  param_place = cert_parameter;
  while(*param_place) {
    span = strcspn(param_place, ":\\");
    strncpy(certname_place, param_place, span);
    param_place += span;
    certname_place += span;
    /* we just ate all the non-special chars. now we're on either a special
     * char or the end of the string. */
    switch(*param_place) {
    case '\0':
      break;
    case '\\':
      param_place++;
      switch(*param_place) {
        case '\0':
          *certname_place++ = '\\';
          break;
        case '\\':
          *certname_place++ = '\\';
          param_place++;
          break;
        case ':':
          *certname_place++ = ':';
          param_place++;
          break;
        default:
          *certname_place++ = '\\';
          *certname_place++ = *param_place;
          param_place++;
          break;
      }
      break;
    case ':':
      /* Since we live in a world of weirdness and confusion, the win32
         dudes can use : when using drive letters and thus c:\file:password
         needs to work. In order not to break compatibility, we still use : as
         separator, but we try to detect when it is used for a file name! On
         windows. */
#ifdef WIN32
      if(param_place &&
          (param_place == &cert_parameter[1]) &&
          (cert_parameter[2] == '\\' || cert_parameter[2] == '/') &&
          (ISALPHA(cert_parameter[0])) ) {
        /* colon in the second column, followed by a backslash, and the
           first character is an alphabetic letter:

           this is a drive letter colon */
        *certname_place++ = ':';
        param_place++;
        break;
      }
#endif
      /* escaped colons and Windows drive letter colons were handled
       * above; if we're still here, this is a separating colon */
      param_place++;
      if(strlen(param_place) > 0) {
        *passphrase = strdup(param_place);
      }
      goto done;
    }
  }
done:
  *certname_place = '\0';
}